

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int ParseInt(char *s,int low,int high,int *result)

{
  int local_30;
  int iStack_2c;
  char c;
  int i;
  int value;
  int *result_local;
  int high_local;
  int low_local;
  char *s_local;
  
  iStack_2c = 0;
  local_30 = 0;
  while( true ) {
    if ((4 < local_30) || (s[local_30] == '\0')) {
      if (local_30 == 0) {
        s_local._4_4_ = 0;
      }
      else if ((local_30 < 2) || (*s != '0')) {
        if (s[local_30] == '\0') {
          if ((iStack_2c < low) || (high < iStack_2c)) {
            s_local._4_4_ = 0;
          }
          else {
            *result = iStack_2c;
            s_local._4_4_ = 1;
          }
        }
        else {
          s_local._4_4_ = 0;
        }
      }
      else {
        s_local._4_4_ = 0;
      }
      return s_local._4_4_;
    }
    if ((s[local_30] < '0') || ('9' < s[local_30])) break;
    iStack_2c = iStack_2c * 10 + s[local_30] + -0x30;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static BROTLI_BOOL ParseInt(const char* s, int low, int high, int* result) {
  int value = 0;
  int i;
  for (i = 0; i < 5; ++i) {
    char c = s[i];
    if (c == 0) break;
    if (s[i] < '0' || s[i] > '9') return BROTLI_FALSE;
    value = (10 * value) + (c - '0');
  }
  if (i == 0) return BROTLI_FALSE;
  if (i > 1 && s[0] == '0') return BROTLI_FALSE;
  if (s[i] != 0) return BROTLI_FALSE;
  if (value < low || value > high) return BROTLI_FALSE;
  *result = value;
  return BROTLI_TRUE;
}